

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O2

int ThreadPoolInit(ThreadPool *tp,ThreadPoolAttr *attr)

{
  ithread_cond_t *__cond;
  ithread_cond_t *__cond_00;
  ThreadPoolAttr *attr_00;
  size_t sVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (tp == (ThreadPool *)0x0) {
    iVar4 = 0x16;
  }
  else {
    iVar4 = pthread_mutex_init((pthread_mutex_t *)tp,(pthread_mutexattr_t *)0x0);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)tp);
    __cond = &tp->condition;
    iVar6 = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
    __cond_00 = &tp->start_and_shutdown;
    iVar7 = pthread_cond_init((pthread_cond_t *)__cond_00,(pthread_condattr_t *)0x0);
    if (iVar7 + iVar6 + iVar5 + iVar4 == 0) {
      attr_00 = &tp->attr;
      if (attr == (ThreadPoolAttr *)0x0) {
        TPAttrInit(attr_00);
      }
      else {
        uVar2 = *(undefined4 *)&attr->field_0x24;
        (tp->attr).schedPolicy = attr->schedPolicy;
        *(undefined4 *)&(tp->attr).field_0x24 = uVar2;
        iVar7 = attr->minThreads;
        iVar3 = attr->maxThreads;
        sVar1 = attr->stackSize;
        iVar4 = attr->jobsPerThread;
        iVar5 = attr->maxJobsTotal;
        iVar6 = attr->starvationTime;
        (tp->attr).maxIdleTime = attr->maxIdleTime;
        (tp->attr).jobsPerThread = iVar4;
        (tp->attr).maxJobsTotal = iVar5;
        (tp->attr).starvationTime = iVar6;
        attr_00->minThreads = iVar7;
        attr_00->maxThreads = iVar3;
        (tp->attr).stackSize = sVar1;
      }
      iVar4 = SetPolicyType((tp->attr).schedPolicy);
      if (iVar4 == 0) {
        iVar4 = FreeListInit(&tp->jobFreeList,0x30,100);
        (tp->stats).totalJobsHQ = 0;
        (tp->stats).totalTimeHQ = 0.0;
        (tp->stats).avgWaitHQ = 0.0;
        (tp->stats).totalTimeMQ = 0.0;
        (tp->stats).totalJobsMQ = 0;
        (tp->stats).avgWaitMQ = 0.0;
        (tp->stats).totalTimeLQ = 0.0;
        (tp->stats).totalJobsLQ = 0;
        (tp->stats).avgWaitLQ = 0.0;
        (tp->stats).totalWorkTime = 0.0;
        (tp->stats).totalIdleTime = 0.0;
        (tp->stats).workerThreads = 0;
        (tp->stats).idleThreads = 0;
        (tp->stats).idleThreads = 0;
        (tp->stats).persistentThreads = 0;
        (tp->stats).totalThreads = 0;
        (tp->stats).maxThreads = 0;
        iVar5 = ListInit(&tp->highJobQ,CmpThreadPoolJob,(free_function)0x0);
        iVar6 = ListInit(&tp->medJobQ,CmpThreadPoolJob,(free_function)0x0);
        iVar7 = ListInit(&tp->lowJobQ,CmpThreadPoolJob,(free_function)0x0);
        if (iVar7 + iVar6 + iVar5 + iVar4 == 0) {
          tp->persistentJob = (ThreadPoolJob *)0x0;
          tp->lastJobId = 0;
          tp->shutdown = 0;
          tp->totalThreads = 0;
          tp->pendingWorkerThreadStart = 0;
          tp->busyThreads = 0;
          tp->persistentThreads = 0;
          iVar4 = -1;
          do {
            iVar4 = iVar4 + 1;
            if ((tp->attr).minThreads <= iVar4) {
              iVar5 = 0;
              break;
            }
            iVar5 = CreateWorker(tp);
          } while (iVar5 == 0);
        }
        else {
          iVar5 = 0xb;
        }
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        iVar4 = 0;
        if (iVar5 != 0) {
          ThreadPoolShutdown(tp);
          iVar4 = iVar5;
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        pthread_mutex_destroy((pthread_mutex_t *)tp);
        pthread_cond_destroy((pthread_cond_t *)__cond);
        pthread_cond_destroy((pthread_cond_t *)__cond_00);
        iVar4 = 0x20000000;
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      pthread_mutex_destroy((pthread_mutex_t *)tp);
      pthread_cond_destroy((pthread_cond_t *)__cond);
      pthread_cond_destroy((pthread_cond_t *)__cond_00);
      iVar4 = 0xb;
    }
  }
  return iVar4;
}

Assistant:

int ThreadPoolInit(ThreadPool *tp, ThreadPoolAttr *attr)
{
	int retCode = 0;
	int i = 0;

	if (!tp) {
		return EINVAL;
	}

	retCode += ithread_mutex_init(&tp->mutex, NULL);
	retCode += ithread_mutex_lock(&tp->mutex);

	retCode += ithread_cond_init(&tp->condition, NULL);
	retCode += ithread_cond_init(&tp->start_and_shutdown, NULL);
	if (retCode) {
		ithread_mutex_unlock(&tp->mutex);
		ithread_mutex_destroy(&tp->mutex);
		ithread_cond_destroy(&tp->condition);
		ithread_cond_destroy(&tp->start_and_shutdown);
		return EAGAIN;
	}
	if (attr) {
		tp->attr = *attr;
	} else {
		TPAttrInit(&tp->attr);
	}
	if (SetPolicyType(tp->attr.schedPolicy) != 0) {
		ithread_mutex_unlock(&tp->mutex);
		ithread_mutex_destroy(&tp->mutex);
		ithread_cond_destroy(&tp->condition);
		ithread_cond_destroy(&tp->start_and_shutdown);

		return INVALID_POLICY;
	}
	retCode += FreeListInit(
		&tp->jobFreeList, sizeof(ThreadPoolJob), JOBFREELISTSIZE);
	StatsInit(&tp->stats);
	retCode += ListInit(&tp->highJobQ, CmpThreadPoolJob, NULL);
	retCode += ListInit(&tp->medJobQ, CmpThreadPoolJob, NULL);
	retCode += ListInit(&tp->lowJobQ, CmpThreadPoolJob, NULL);
	if (retCode) {
		retCode = EAGAIN;
	} else {
		tp->persistentJob = NULL;
		tp->lastJobId = 0;
		tp->shutdown = 0;
		tp->totalThreads = 0;
		tp->busyThreads = 0;
		tp->persistentThreads = 0;
		tp->pendingWorkerThreadStart = 0;
		for (i = 0; i < tp->attr.minThreads; ++i) {
			retCode = CreateWorker(tp);
			if (retCode) {
				break;
			}
		}
	}

	ithread_mutex_unlock(&tp->mutex);

	if (retCode) {
		/* clean up if the min threads could not be created */
		ThreadPoolShutdown(tp);
	}

	return retCode;
}